

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

RangeStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_rangestatic(NeuralNetworkLayer *this)

{
  ulong uVar1;
  RangeStaticLayerParams *pRVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x27b) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x27b;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pRVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::RangeStaticLayerParams>(arena);
    (this->layer_).rangestatic_ = pRVar2;
  }
  return (RangeStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RangeStaticLayerParams* NeuralNetworkLayer::_internal_mutable_rangestatic() {
  if (!_internal_has_rangestatic()) {
    clear_layer();
    set_has_rangestatic();
    layer_.rangestatic_ = CreateMaybeMessage< ::CoreML::Specification::RangeStaticLayerParams >(GetArenaForAllocation());
  }
  return layer_.rangestatic_;
}